

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall Js::CharArray::DirectSetItem(CharArray *this,uint32 index,Var value)

{
  Type puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  uint uVar6;
  ScriptContext *scriptContext_00;
  JavascriptString *pJVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  ArrayBufferBase *pAVar9;
  size_t sVar10;
  char16 *typedBuffer;
  LPCWSTR asString;
  ScriptContext *scriptContext;
  Var value_local;
  uint32 index_local;
  CharArray *this_local;
  char16_t *string;
  
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pJVar7 = JavascriptConversion::ToString(value,scriptContext_00);
  iVar4 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  string = (char16_t *)CONCAT44(extraout_var,iVar4);
  bVar3 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if (bVar3) {
    JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  uVar5 = ArrayObject::GetLength((ArrayObject *)this);
  if (uVar5 <= index) {
    return 0;
  }
  uVar5 = ArrayObject::GetLength((ArrayObject *)this);
  if (uVar5 <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xd1a,"(index < GetLength())",
                                "Trying to set out of bound index for typed array.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  uVar5 = Js::TypedArrayBase::GetByteOffset(&this->super_TypedArrayBase);
  pAVar9 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
  uVar6 = (*(pAVar9->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar6 < (ulong)(index + 1) * 2 + (ulong)uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xd1b,
                                "((index + 1)* sizeof(char16) + GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                ,
                                "(index + 1)* sizeof(char16) + GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  puVar1 = (this->super_TypedArrayBase).buffer;
  if ((string != (char16_t *)0x0) && (sVar10 = PAL_wcslen(string), sVar10 == 1)) {
    *(char16_t *)(puVar1 + (ulong)index * 2) = *string;
    return 1;
  }
  JavascriptError::MapAndThrowError(scriptContext_00,-0x7ff8ffa9);
}

Assistant:

inline BOOL CharArray::DirectSetItem(__in uint32 index, __in Js::Var value)
    {
        ScriptContext* scriptContext = GetScriptContext();
        // A typed array is Integer Indexed Exotic object, so doing a get translates to 9.4.5.9 IntegerIndexedElementSet
        LPCWSTR asString = (Js::JavascriptConversion::ToString(value, scriptContext))->GetSz();

        if (this->IsDetachedBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
        }

        if (index >= GetLength())
        {
            return FALSE;
        }

        AssertMsg(index < GetLength(), "Trying to set out of bound index for typed array.");
        Assert((index + 1)* sizeof(char16) + GetByteOffset() <= GetArrayBuffer()->GetByteLength());
        char16* typedBuffer = (char16*)buffer;

        if (asString != NULL && ::wcslen(asString) == 1)
        {
            typedBuffer[index] = asString[0];
        }
        else
        {
            Js::JavascriptError::MapAndThrowError(scriptContext, E_INVALIDARG);
        }

        return TRUE;
    }